

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* boost::ext::ut::v1_1_8::utility::
  split<std::basic_string_view<char,std::char_traits<char>>,char_const*>
            (basic_string_view<char,_std::char_traits<char>_> input,char *delim)

{
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *pvVar1;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  size_type second;
  size_t first;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *output;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *this;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *local_30;
  
  this_00 = in_RDI;
  memset(in_RDI,0,0x18);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)0x1100b6);
  local_30 = (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)0x0;
  while( true ) {
    this = local_30;
    pvVar1 = (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)std::size<std::basic_string_view<char,std::char_traits<char>>>
                          ((basic_string_view<char,_std::char_traits<char>_> *)0x1100d3);
    if (pvVar1 <= this) {
      return (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)in_RDI;
    }
    pvVar1 = (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                          (this_00,(char *)in_RDI,(size_type)this);
    if (local_30 != pvVar1) {
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (this_00,(size_type)in_RDI,(size_type)this);
      std::
      vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                (this,(basic_string_view<char,_std::char_traits<char>_> *)bVar2._M_len);
    }
    if (pvVar1 == (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)0xffffffffffffffff) break;
    local_30 = (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)((long)&(pvVar1->
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1);
  }
  return (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          *)in_RDI;
}

Assistant:

[[nodiscard]] inline auto split(T input, TDelim delim) -> std::vector<T> {
    std::vector<T> output{};
    std::size_t first{};
    while (first < std::size(input)) {
      const auto second = input.find_first_of(delim, first);
      if (first != second) {
        output.emplace_back(input.substr(first, second - first));
      }
      if (second == T::npos) {
        break;
      }
      first = second + 1;
    }
    return output;
  }